

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitBlock
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Block *curr)

{
  array<wasm::Literal,_1UL> *this_00;
  Block *pBVar1;
  Block *pBVar2;
  char *pcVar3;
  ulong uVar4;
  Flow local_d8;
  ExpressionRunner<wasm::ModuleRunner> *local_90;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_88;
  Name *local_68;
  Literal *local_60;
  pointer ppBStack_58;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> stack;
  Block *local_38;
  Block *curr_local;
  
  ppBStack_58 = (pointer)0x0;
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = this;
  local_38 = curr;
  std::vector<wasm::Block*,std::allocator<wasm::Block*>>::_M_realloc_insert<wasm::Block*const&>
            ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)&ppBStack_58,(iterator)0x0,
             &local_38);
  if (*(long *)(local_38 + 0x28) != 0) {
    do {
      pBVar1 = (Block *)**(undefined8 **)(local_38 + 0x20);
      if (*(int *)pBVar1 != 1) break;
      local_38 = pBVar1;
      if (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Block*,std::allocator<wasm::Block*>>::
        _M_realloc_insert<wasm::Block*const&>
                  ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)&ppBStack_58,
                   (iterator)
                   stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_38);
      }
      else {
        *stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
         super__Vector_impl_data._M_start = pBVar1;
        stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
    } while (*(long *)(local_38 + 0x28) != 0);
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  if (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppBStack_58) {
    pBVar1 = stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start[-1];
    local_68 = &__return_storage_ptr__->breakTo;
    local_60 = (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
    ;
    this_00 = &local_d8.values.super_SmallVector<wasm::Literal,_1UL>.fixed;
    do {
      pBVar2 = stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start[-1];
      stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      pcVar3 = (__return_storage_ptr__->breakTo).super_IString.str._M_str;
      local_38 = pBVar2;
      if (pcVar3 == (char *)0x0) {
        if (*(long *)(pBVar2 + 0x28) != 0) {
          uVar4 = 0;
          do {
            if ((uVar4 != 0) || (local_38 == pBVar1)) {
              if (*(ulong *)(pBVar2 + 0x28) <= uVar4) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              visit(&local_d8,local_90,*(Expression **)(*(long *)(pBVar2 + 0x20) + uVar4 * 8));
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
                   local_d8.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
              wasm::Literal::operator=(local_60,this_00->_M_elems);
              local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_88);
              (local_68->super_IString).str._M_len = local_d8.breakTo.super_IString.str._M_len;
              (local_68->super_IString).str._M_str = local_d8.breakTo.super_IString.str._M_str;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        (&local_d8.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
              wasm::Literal::~Literal(this_00->_M_elems);
              pcVar3 = (__return_storage_ptr__->breakTo).super_IString.str._M_str;
              if (pcVar3 != (char *)0x0) {
                if (pcVar3 == *(char **)(local_38 + 0x18)) goto LAB_001251ef;
                break;
              }
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(ulong *)(pBVar2 + 0x28));
        }
      }
      else if (pcVar3 == *(char **)(pBVar2 + 0x18)) {
LAB_001251ef:
        (local_68->super_IString).str._M_len = 0;
        (local_68->super_IString).str._M_str = (char *)0x0;
      }
    } while (stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start != ppBStack_58);
  }
  if (ppBStack_58 != (pointer)0x0) {
    operator_delete(ppBStack_58,
                    (long)stack.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppBStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitBlock(Block* curr) {
    NOTE_ENTER("Block");
    // special-case Block, because Block nesting (in their first element) can be
    // incredibly deep
    std::vector<Block*> stack;
    stack.push_back(curr);
    while (curr->list.size() > 0 && curr->list[0]->is<Block>()) {
      curr = curr->list[0]->cast<Block>();
      stack.push_back(curr);
    }
    Flow flow;
    auto* top = stack.back();
    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (flow.breaking()) {
        flow.clearIf(curr->name);
        continue;
      }
      auto& list = curr->list;
      for (size_t i = 0; i < list.size(); i++) {
        if (curr != top && i == 0) {
          // one of the block recursions we already handled
          continue;
        }
        flow = visit(list[i]);
        if (flow.breaking()) {
          flow.clearIf(curr->name);
          break;
        }
      }
    }
    return flow;
  }